

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HinOut.cpp
# Opt level: O3

void __thiscall HinOut::readDataColumnWise(HinOut *this)

{
  int *piVar1;
  vector<int,_std::allocator<int>_> *this_00;
  vector<int,_std::allocator<int>_> *this_01;
  vector<double,_std::allocator<double>_> *pvVar2;
  int *piVar3;
  vector<double,_std::allocator<double>_> *this_02;
  int iVar4;
  vector<double,_std::allocator<double>_> *pvVar5;
  long lVar6;
  long lVar7;
  ifstream f;
  value_type_conflict1 local_248;
  vector<double,_std::allocator<double>_> *local_240;
  string local_238 [520];
  
  std::ifstream::ifstream(local_238);
  std::ifstream::open(local_238,(int)this + 0x7b0);
  std::istream::operator>>((istream *)local_238,(int *)this);
  piVar1 = &(this->super_HPreData).numRow;
  std::istream::operator>>((istream *)local_238,piVar1);
  piVar3 = &this->AcountX;
  std::istream::operator>>((istream *)local_238,piVar3);
  this_00 = &(this->super_HPreData).Astart;
  std::vector<int,_std::allocator<int>_>::resize(this_00,(long)(this->super_HPreData).numCol + 1);
  this_01 = &(this->super_HPreData).Aindex;
  std::vector<int,_std::allocator<int>_>::resize(this_01,(long)this->AcountX);
  local_240 = &(this->super_HPreData).Avalue;
  std::vector<double,_std::allocator<double>_>::resize(local_240,(long)this->AcountX);
  if (-1 < (this->super_HPreData).numCol) {
    lVar6 = -1;
    lVar7 = 0;
    do {
      std::istream::operator>>
                ((istream *)local_238,
                 (int *)((long)(this_00->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                               super__Vector_impl_data._M_start + lVar7));
      lVar6 = lVar6 + 1;
      lVar7 = lVar7 + 4;
    } while (lVar6 < (this->super_HPreData).numCol);
  }
  if (0 < *piVar3) {
    lVar6 = 0;
    lVar7 = 0;
    do {
      std::istream::operator>>
                ((istream *)local_238,
                 (int *)((long)(this_01->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                               super__Vector_impl_data._M_start + lVar6));
      lVar7 = lVar7 + 1;
      lVar6 = lVar6 + 4;
    } while (lVar7 < *piVar3);
    if (0 < *piVar3) {
      lVar6 = 0;
      do {
        std::istream::_M_extract<double>((double *)local_238);
        lVar6 = lVar6 + 1;
      } while (lVar6 < *piVar3);
    }
  }
  pvVar2 = &(this->super_HPreData).colCost;
  std::vector<double,_std::allocator<double>_>::reserve(pvVar2,(long)(this->super_HPreData).numCol);
  pvVar5 = &(this->super_HPreData).colLower;
  std::vector<double,_std::allocator<double>_>::reserve(pvVar5,(long)(this->super_HPreData).numCol);
  this_02 = &(this->super_HPreData).colUpper;
  std::vector<double,_std::allocator<double>_>::reserve(this_02,(long)(this->super_HPreData).numCol)
  ;
  local_248 = 0.0;
  std::vector<double,_std::allocator<double>_>::_M_fill_assign
            (pvVar2,(long)(this->super_HPreData).numCol,&local_248);
  local_248 = -1e+200;
  std::vector<double,_std::allocator<double>_>::_M_fill_assign
            (pvVar5,(long)(this->super_HPreData).numCol,&local_248);
  std::vector<double,_std::allocator<double>_>::_M_fill_assign
            (this_02,(long)(this->super_HPreData).numCol,(value_type_conflict1 *)&HSOL_CONST_INF);
  if (0 < (this->super_HPreData).numCol) {
    lVar6 = 0;
    do {
      std::istream::_M_extract<double>((double *)local_238);
      lVar6 = lVar6 + 1;
      iVar4 = (this->super_HPreData).numCol;
    } while (lVar6 < iVar4);
    if (0 < iVar4) {
      lVar6 = 0;
      do {
        std::istream::_M_extract<double>((double *)local_238);
        lVar6 = lVar6 + 1;
        iVar4 = (this->super_HPreData).numCol;
      } while (lVar6 < iVar4);
      if (0 < iVar4) {
        lVar6 = 0;
        do {
          std::istream::_M_extract<double>((double *)local_238);
          lVar6 = lVar6 + 1;
        } while (lVar6 < (this->super_HPreData).numCol);
      }
    }
  }
  pvVar2 = &(this->super_HPreData).rowLower;
  std::vector<double,_std::allocator<double>_>::reserve(pvVar2,(long)(this->super_HPreData).numRow);
  pvVar5 = &(this->super_HPreData).rowUpper;
  std::vector<double,_std::allocator<double>_>::reserve(pvVar5,(long)(this->super_HPreData).numRow);
  local_248 = -1e+200;
  std::vector<double,_std::allocator<double>_>::_M_fill_assign(pvVar2,(long)*piVar1,&local_248);
  std::vector<double,_std::allocator<double>_>::_M_fill_assign
            (pvVar5,(long)*piVar1,(value_type_conflict1 *)&HSOL_CONST_INF);
  if (0 < *piVar1) {
    lVar6 = 0;
    do {
      std::istream::_M_extract<double>((double *)local_238);
      lVar6 = lVar6 + 1;
    } while (lVar6 < *piVar1);
    if (0 < *piVar1) {
      lVar6 = 0;
      do {
        std::istream::_M_extract<double>((double *)local_238);
        lVar6 = lVar6 + 1;
      } while (lVar6 < *piVar1);
    }
  }
  std::ifstream::close();
  std::ifstream::~ifstream(local_238);
  return;
}

Assistant:

void HinOut::readDataColumnWise() {
	ifstream f;
	int i;

	f.open (fileIn, ios::in );

	//counts
	f >> numCol ;
	f >> numRow ;
	f >> AcountX ;

	//matrix
	Astart.resize(numCol + 1);
	Aindex.resize(AcountX);
	Avalue.resize(AcountX);

	for (i=0; i<numCol +1; i++)
		f >> Astart[i];


	for (i=0; i<AcountX; i++)
		f >> Aindex[i];


	for (i=0; i<AcountX; i++)
		f >> Avalue[i];

	//f >> flush;

	//compareData(0);

	//cost and bounds
	colCost.reserve(numCol);
	colLower.reserve(numCol);
	colUpper.reserve(numCol);

	colCost.assign(numCol, 0);
	colLower.assign(numCol, -HSOL_CONST_INF);
	colUpper.assign(numCol, HSOL_CONST_INF);



	for (i=0; i<numCol; i++) {
		f >> colCost[i];
	}


	for (i=0; i<numCol; i++) {
		f >> colLower[i];
	}


	for (i=0; i<numCol; i++) {
		f >> colUpper[i];
	}

	//compareData(1);

	rowLower.reserve(numRow);
	rowUpper.reserve(numRow);
	rowLower.assign(numRow, -HSOL_CONST_INF);
    rowUpper.assign(numRow, HSOL_CONST_INF);

	for (i=0; i<numRow; i++) {
			f >> rowLower[i];
	}

	for (i=0; i<numRow; i++){
			f >> rowUpper[i];
	}

	f.close();

}